

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_ifelse::run_impl(statement_ifelse *this)

{
  bool bVar1;
  bool *pbVar2;
  element_type *peVar3;
  long in_RDI;
  exception *e_2;
  exception *e_3;
  statement_base **ptr_1;
  iterator __end2_1;
  iterator __begin2_1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2_1;
  scope_guard scope_1;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end2;
  iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  scope_guard scope;
  undefined1 in_stack_000006ff;
  iterator *in_stack_00000700;
  runtime_type *in_stack_00000708;
  _Self *in_stack_fffffffffffffdb8;
  _Self *in_stack_fffffffffffffdc0;
  any *in_stack_fffffffffffffe40;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_128;
  long local_108;
  reference local_80;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_58;
  long local_38;
  tree_node *local_18;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1dd435);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1dd441);
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdb8);
  runtime_type::parse_expr(in_stack_00000708,in_stack_00000700,(bool)in_stack_000006ff);
  pbVar2 = cs_impl::any::const_val<bool>(in_stack_fffffffffffffe40);
  bVar1 = *pbVar2;
  cs_impl::any::~any((any *)0x1dd4a6);
  if ((bVar1 & 1U) == 0) {
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffdc0,(context_t *)in_stack_fffffffffffffdb8);
    local_108 = in_RDI + 0x78;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffdb8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffdb8);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8), bVar1) {
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator*(&local_128);
      statement_base::run((statement_base *)in_stack_fffffffffffffdc0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ddbd7);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ddbe3);
      if ((peVar3->return_fcall & 1U) != 0) break;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ddbfa);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ddc06);
      if ((peVar3->break_block & 1U) != 0) break;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ddc1d);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ddc29);
      if ((peVar3->continue_block & 1U) != 0) break;
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++(in_stack_fffffffffffffdc0);
    }
    scope_guard::~scope_guard((scope_guard *)0x1ddc55);
  }
  else {
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffdc0,(context_t *)in_stack_fffffffffffffdb8);
    local_38 = in_RDI + 0x28;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffdb8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffdb8);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8), bVar1) {
      local_80 = std::
                 _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                 ::operator*(&local_58);
      statement_base::run((statement_base *)in_stack_fffffffffffffdc0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dd80e);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd81a);
      if ((peVar3->return_fcall & 1U) != 0) break;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dd831);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd83d);
      if ((peVar3->break_block & 1U) != 0) break;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dd854);
      peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd860);
      if ((peVar3->continue_block & 1U) != 0) break;
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++(in_stack_fffffffffffffdc0);
    }
    scope_guard::~scope_guard((scope_guard *)0x1dd88c);
  }
  return;
}

Assistant:

void statement_ifelse::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
		else {
			scope_guard scope(context);
			for (auto &ptr: mElseBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}